

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  short *psVar2;
  char cVar3;
  byte bVar4;
  uint16_t uVar5;
  ptls_cipher_suite_t *ppVar6;
  ptls_key_exchange_context_t *ppVar7;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar8;
  ptls_key_schedule_t *ppVar9;
  st_ptls_on_extension_t *psVar10;
  st_ptls_update_traffic_key_t *psVar11;
  bool bVar12;
  ushort *puVar13;
  int iVar14;
  uint8_t *puVar15;
  ushort uVar16;
  uint uVar17;
  ptls_key_exchange_algorithm_t **pppVar18;
  ptls_hash_context_t **pppVar19;
  long lVar20;
  ptls_message_emitter_t *emitter_00;
  uint8_t *puVar21;
  ushort *puVar22;
  size_t sVar23;
  ushort *puVar24;
  ptls_cipher_suite_t **pppVar25;
  ulong uVar26;
  ushort uVar27;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ptls_iovec_t pVar32;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar33;
  st_ptls_server_hello_t sh;
  ushort *local_f8;
  ushort local_ea;
  ushort *local_e8;
  uint local_dc;
  ptls_key_schedule_t *local_d8;
  uint16_t local_ca;
  ushort *local_c8;
  byte local_c0 [8];
  ushort *local_b8;
  ptls_hash_context_t **local_b0;
  ptls_iovec_t local_a8;
  ushort *local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  undefined1 auStack_50 [8];
  ptls_iovec_t local_48;
  uint uVar28;
  
  puVar15 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  if ((tls->field_0x160 & 0x20) != 0) {
LAB_00112e6b:
    iVar14 = server_handle_hello(tls,emitter,message,properties);
    return iVar14;
  }
  uVar17 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xe < uVar17) {
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x113d,
                  "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar3 = *(char *)&emitter_00->buf;
  message_00.len =
       (ptls_handshake_properties_t *)
       ((long)&switchD_00112d1a::switchdataD_001201a0 +
       (long)(int)(&switchD_00112d1a::switchdataD_001201a0)[uVar17]);
  switch(tls->state) {
  default:
    if (is_end_of_record == 0 || cVar3 != '\x02') {
      return 10;
    }
    local_a8.base = (uint8_t *)0x0;
    local_a8.len = 0;
    local_f8 = (ushort *)((long)&emitter_00->buf + 4);
    local_88 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    _local_58 = (undefined1  [16])0x0;
    local_48.base = (uint8_t *)0x0;
    local_48.len = 0;
    uVar17 = 0x32;
    if ((5 < (long)puVar15) &&
       (local_f8 = (ushort *)((long)&emitter_00->buf + 6), 0x25 < (long)puVar15)) {
      auVar31[0] = -(*(char *)((long)&emitter_00->record_header_length + 6) == -0x3e);
      auVar31[1] = -(*(char *)((long)&emitter_00->record_header_length + 7) == -0x5e);
      auVar31[2] = -(*(char *)&emitter_00->begin_message == '\x11');
      auVar31[3] = -(*(char *)((long)&emitter_00->begin_message + 1) == '\x16');
      auVar31[4] = -(*(char *)((long)&emitter_00->begin_message + 2) == 'z');
      auVar31[5] = -(*(char *)((long)&emitter_00->begin_message + 3) == -0x45);
      auVar31[6] = -(*(char *)((long)&emitter_00->begin_message + 4) == -0x74);
      auVar31[7] = -(*(char *)((long)&emitter_00->begin_message + 5) == '^');
      auVar31[8] = -(*(char *)((long)&emitter_00->begin_message + 6) == '\a');
      auVar31[9] = -(*(char *)((long)&emitter_00->begin_message + 7) == -0x62);
      auVar31[10] = -(*(char *)&emitter_00->commit_message == '\t');
      auVar31[0xb] = -(*(char *)((long)&emitter_00->commit_message + 1) == -0x1e);
      auVar31[0xc] = -(*(char *)((long)&emitter_00->commit_message + 2) == -0x38);
      auVar31[0xd] = -(*(char *)((long)&emitter_00->commit_message + 3) == -0x58);
      auVar31[0xe] = -(*(char *)((long)&emitter_00->commit_message + 4) == '3');
      auVar31[0xf] = -(*(char *)((long)&emitter_00->commit_message + 5) == -100);
      auVar30[0] = -(*(char *)((long)&emitter_00->buf + 6) == -0x31);
      auVar30[1] = -(*(char *)((long)&emitter_00->buf + 7) == '!');
      auVar30[2] = -(*(char *)&emitter_00->enc == -0x53);
      auVar30[3] = -(*(char *)((long)&emitter_00->enc + 1) == 't');
      auVar30[4] = -(*(char *)((long)&emitter_00->enc + 2) == -0x1b);
      auVar30[5] = -(*(char *)((long)&emitter_00->enc + 3) == -0x66);
      auVar30[6] = -(*(char *)((long)&emitter_00->enc + 4) == 'a');
      auVar30[7] = -(*(char *)((long)&emitter_00->enc + 5) == '\x11');
      auVar30[8] = -(*(char *)((long)&emitter_00->enc + 6) == -0x42);
      auVar30[9] = -(*(char *)((long)&emitter_00->enc + 7) == '\x1d');
      auVar30[10] = -((char)emitter_00->record_header_length == -0x74);
      auVar30[0xb] = -(*(char *)((long)&emitter_00->record_header_length + 1) == '\x02');
      auVar30[0xc] = -(*(char *)((long)&emitter_00->record_header_length + 2) == '\x1e');
      auVar30[0xd] = -(*(char *)((long)&emitter_00->record_header_length + 3) == 'e');
      auVar30[0xe] = -(*(char *)((long)&emitter_00->record_header_length + 4) == -0x48);
      auVar30[0xf] = -(*(char *)((long)&emitter_00->record_header_length + 5) == -0x6f);
      auVar30 = auVar30 & auVar31;
      local_58[0] = (ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff;
      local_58._1_3_ = 0;
      stack0xffffffffffffffac = SUB1612((undefined1  [16])0x0,4);
      local_f8 = (ushort *)((long)&emitter_00->commit_message + 6);
      if (puVar15 != (uint8_t *)0x26) {
        local_f8 = (ushort *)((long)&emitter_00->commit_message + 7);
        bVar4 = *(byte *)((long)&emitter_00->commit_message + 6);
        puVar21 = (uint8_t *)(ulong)bVar4;
        if (puVar21 <= puVar15 + -0x27 && puVar21 < (uint8_t *)0x21) {
          pppVar19 = (ptls_hash_context_t **)(puVar15 + (long)&emitter_00->buf);
          puVar24 = (ushort *)((long)local_f8 + (long)puVar21);
          local_68[8] = bVar4;
          local_68._0_8_ = local_f8;
          local_68._9_7_ = 0;
          if ((long)pppVar19 - (long)puVar24 < 2) {
            bVar29 = false;
            local_f8 = puVar24;
            uVar28 = 0x32;
          }
          else {
            local_f8 = puVar24 + 1;
            pppVar25 = tls->ctx->cipher_suites;
            ppVar6 = *pppVar25;
            while ((ppVar6 != (ptls_cipher_suite_t *)0x0 &&
                   (pppVar25 = pppVar25 + 1, ppVar6->id != (uint16_t)(*puVar24 << 8 | *puVar24 >> 8)
                   ))) {
              ppVar6 = *pppVar25;
            }
            tls->cipher_suite = ppVar6;
            bVar29 = ppVar6 != (ptls_cipher_suite_t *)0x0;
            uVar28 = 0x2f;
            if (bVar29) {
              uVar28 = 0;
            }
          }
          uVar17 = uVar28;
          if (bVar29) {
            puVar24 = local_f8;
            if (((ptls_hash_context_t **)local_f8 == pppVar19) ||
               (puVar24 = (ushort *)((long)local_f8 + 1), (char)*local_f8 != '\0')) {
LAB_0011316d:
              local_f8 = puVar24;
              uVar17 = 0x2f;
            }
            else {
              if ((bool)local_58[0]) {
                auStack_50._0_2_ = 0xffff;
                auStack_50._2_6_ = 0;
              }
              local_c0[0] = 0x21;
              local_c0[1] = 0x24;
              local_c0[2] = 1;
              local_c0[3] = 0;
              local_c0[4] = 0;
              local_c0[5] = 0x24;
              local_c0[6] = 0;
              local_c0[7] = 0;
              uVar17 = 0x32;
              local_b0 = pppVar19;
              if ((ulong)((long)pppVar19 - (long)puVar24) < 2) {
LAB_001134ec:
                local_f8 = puVar24;
                local_d8 = (ptls_key_schedule_t *)CONCAT62(local_d8._2_6_,0xffff);
                bVar29 = false;
                uVar16 = 0xffff;
              }
              else {
                local_d8 = (ptls_key_schedule_t *)CONCAT62(local_d8._2_6_,0xffff);
                lVar20 = 0;
                uVar26 = 0;
                do {
                  uVar26 = (ulong)*(byte *)((long)puVar24 + lVar20) | uVar26 << 8;
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 2);
                local_f8 = (ushort *)((long)local_f8 + 3);
                puVar24 = local_f8;
                if ((ulong)((long)pppVar19 - (long)local_f8) < uVar26) goto LAB_001134ec;
                if (uVar26 == 0) {
                  uVar17 = uVar28;
                  uVar16 = 0xffff;
                }
                else {
                  puVar24 = (ushort *)(uVar26 + (long)local_f8);
                  local_ea = 0xffff;
                  local_d8 = (ptls_key_schedule_t *)CONCAT62(local_d8._2_6_,0xffff);
                  local_e8 = puVar24;
                  do {
                    uVar17 = 0x32;
                    if ((long)puVar24 - (long)local_f8 < 2) {
LAB_001139c2:
                      bVar29 = false;
                      uVar16 = local_ea;
                      goto LAB_001134f2;
                    }
                    uVar16 = *local_f8;
                    uVar27 = uVar16 << 8 | uVar16 >> 8;
                    uVar28 = (uint)uVar27;
                    puVar22 = local_f8 + 1;
                    if (uVar27 < 0x40) {
                      if ((local_c0[uVar27 >> 3] >> (uVar28 & 7) & 1) != 0) {
                        uVar17 = 0x2f;
                        local_f8 = puVar22;
                        goto LAB_001139c2;
                      }
                      local_c0[uVar27 >> 3] =
                           local_c0[uVar27 >> 3] | (byte)(1 << ((byte)(uVar16 >> 8) & 7));
                    }
                    uVar17 = 0x32;
                    bVar29 = true;
                    puVar13 = puVar22;
                    if (1 < (ulong)((long)puVar24 - (long)puVar22)) {
                      lVar20 = 0;
                      uVar26 = 0;
                      do {
                        uVar26 = (ulong)*(byte *)((long)puVar22 + lVar20) | uVar26 << 8;
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != 2);
                      local_f8 = local_f8 + 2;
                      puVar13 = local_f8;
                      if (uVar26 <= (ulong)((long)puVar24 - (long)local_f8)) {
                        local_b8 = puVar22;
                        psVar10 = tls->ctx->on_extension;
                        local_90 = local_f8;
                        local_dc = uVar28;
                        if (psVar10 == (st_ptls_on_extension_t *)0x0) {
                          uVar28 = 0;
LAB_001136c4:
                          local_c8 = (ushort *)((long)local_90 + uVar26);
                          puVar24 = local_e8;
                          uVar17 = uVar28;
                          puVar22 = local_c8;
                          if ((int)local_dc < 0x2c) {
                            if (local_dc == 0x29) {
                              uVar17 = 0x2f;
                              if (local_58._0_4_ == 0) {
                                uVar17 = 0x32;
                                if (1 < (long)uVar26) {
                                  local_ea = local_b8[1] << 8 | local_b8[1] >> 8;
                                  goto LAB_00113787;
                                }
                                goto LAB_00113792;
                              }
                            }
                            else {
                              if (local_dc != 0x2b) goto LAB_001137a8;
                              uVar17 = 0x32;
                              if (1 < (long)uVar26) {
                                local_d8 = (ptls_key_schedule_t *)
                                           CONCAT62(local_d8._2_6_,
                                                    local_b8[1] << 8 | local_b8[1] >> 8);
LAB_00113787:
                                local_f8 = local_b8 + 2;
                                uVar17 = 0;
                              }
LAB_00113792:
                              if (1 < (long)uVar26) {
                                uVar17 = 0;
                                puVar22 = local_f8;
                                goto LAB_001137a8;
                              }
                            }
LAB_00113842:
                            bVar29 = true;
                            puVar13 = local_f8;
                          }
                          else {
                            if (local_dc == 0x2c) {
                              if (local_58._0_4_ == 0) {
                                uVar17 = 0x2f;
                                goto LAB_00113842;
                              }
                              bVar29 = true;
                              uVar17 = 0x32;
                              if (uVar26 < 2) {
                                bVar12 = false;
                              }
                              else {
                                lVar20 = 0;
                                uVar26 = 0;
                                do {
                                  uVar26 = (ulong)*(byte *)((long)local_90 + lVar20) | uVar26 << 8;
                                  lVar20 = lVar20 + 1;
                                } while (lVar20 != 2);
                                puVar22 = local_b8 + 2;
                                bVar12 = false;
                                local_f8 = puVar22;
                                if (uVar26 - 1 < (ulong)((long)local_c8 - (long)puVar22)) {
                                  local_f8 = (ushort *)((long)local_b8 + uVar26 + 4);
                                  local_48.len = (long)local_f8 - (long)puVar22;
                                  local_48.base = (uint8_t *)puVar22;
                                  bVar12 = true;
                                  bVar29 = false;
                                  uVar17 = uVar28;
                                }
                              }
                              puVar13 = local_f8;
                              if (!bVar12) goto LAB_00113851;
                              puVar22 = local_f8;
                              if (local_f8 != local_c8) {
                                uVar17 = 0x32;
                                goto LAB_001136ae;
                              }
                            }
                            else if (local_dc == 0x33) {
                              if (local_58._0_4_ != 0) {
                                uVar17 = 0x32;
                                if (1 < (long)uVar26) {
                                  auStack_50._0_2_ = local_b8[1] << 8 | local_b8[1] >> 8;
                                  goto LAB_00113787;
                                }
                                goto LAB_00113792;
                              }
                              uVar17 = decode_key_share_entry
                                                 (&local_ca,(ptls_iovec_t *)auStack_50,
                                                  (uint8_t **)&local_f8,(uint8_t *)local_c8);
                              bVar29 = true;
                              if (uVar17 == 0) {
                                if (local_f8 != local_c8) {
                                  uVar17 = 0x32;
                                  goto LAB_00113827;
                                }
                                uVar17 = 0x2f;
                                if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0)
                                goto LAB_00113827;
                                bVar12 = false;
                                if (tls->key_share->id == local_ca) {
                                  bVar12 = true;
                                  bVar29 = false;
                                  uVar17 = 0;
                                }
                              }
                              else {
LAB_00113827:
                                bVar12 = false;
                              }
                              puVar24 = local_e8;
                              puVar13 = local_f8;
                              puVar22 = local_f8;
                              if (!bVar12) goto LAB_00113851;
                            }
LAB_001137a8:
                            local_f8 = puVar22;
                            bVar29 = local_f8 != local_c8;
                            puVar24 = local_e8;
                            puVar13 = local_f8;
                            if (bVar29) {
                              uVar17 = 0x32;
                            }
                          }
                        }
                        else {
                          pVar33.len = uVar26;
                          pVar33.base = (uint8_t *)local_f8;
                          iVar14 = (*psVar10->cb)(psVar10,tls,'\x02',uVar27,pVar33);
                          uVar17 = (uint)(iVar14 != 0);
                          uVar28 = uVar17;
                          if (iVar14 == 0) goto LAB_001136c4;
LAB_001136ae:
                          bVar29 = true;
                          puVar24 = local_e8;
                          puVar13 = local_f8;
                        }
                      }
                    }
LAB_00113851:
                    local_f8 = puVar13;
                    if (bVar29) goto LAB_001139c2;
                    uVar16 = local_ea;
                  } while (local_f8 != puVar24);
                }
                bVar29 = true;
              }
LAB_001134f2:
              if ((bVar29) && (uVar17 = 0x32, (ptls_hash_context_t **)local_f8 == local_b0)) {
                lVar20 = 0;
                do {
                  psVar2 = (short *)((long)supported_versions + lVar20);
                  if (*psVar2 == (short)local_d8) break;
                  bVar29 = lVar20 != 6;
                  lVar20 = lVar20 + 2;
                } while (bVar29);
                puVar24 = local_f8;
                if (*psVar2 != (short)local_d8) goto LAB_0011316d;
                if (local_58._0_4_ == 0) {
                  if (uVar16 != 0xffff) {
                    if ((uVar16 != 0) ||
                       (((tls->field_20).server.pending_traffic_secret[0x28] & 1) == 0))
                    goto LAB_0011316d;
                    tls->field_0x160 = tls->field_0x160 | 2;
                  }
                  if ((auStack_50 == (undefined1  [8])0x0) &&
                     (uVar17 = 0x2f, (tls->field_0x160 & 2) == 0)) goto LAB_00113172;
                }
                uVar17 = 0;
              }
            }
          }
        }
      }
    }
LAB_00113172:
    if (uVar17 == 0) {
      uVar17 = 0x2f;
      if (local_68._8_8_ == 0x20) {
        iVar14 = (*ptls_mem_equal)((void *)local_68._0_8_,&tls->field_20,0x20);
        if (iVar14 != 0) {
          if (local_58._0_4_ == 0) {
            uVar17 = 0;
            if (((tls->field_20).server.pending_traffic_secret[0x28] & 1) != 0) {
              uVar17 = (uint)((tls->field_0x160 & 2) == 0);
            }
            uVar17 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,uVar17);
            if (uVar17 == 0) {
              if (auStack_50 != (undefined1  [8])0x0) {
                pVar32.len = (size_t)local_48.base;
                pVar32.base = (uint8_t *)auStack_50;
                uVar17 = (*((tls->field_20).client.key_share_ctx)->on_exchange)
                                   (&(tls->field_20).client.key_share_ctx,1,&local_a8,pVar32);
                if (uVar17 != 0) goto LAB_001132d1;
              }
              ppVar9 = tls->key_schedule;
              if (ppVar9->num_hashes != 0) {
                pppVar19 = &ppVar9->hashes[0].ctx;
                sVar23 = 0;
                do {
                  (*(*pppVar19)->update)(*pppVar19,emitter_00,(size_t)puVar15);
                  sVar23 = sVar23 + 1;
                  pppVar19 = pppVar19 + 2;
                } while (sVar23 != ppVar9->num_hashes);
              }
              uVar17 = key_schedule_extract(tls->key_schedule,local_a8);
              if ((uVar17 == 0) &&
                 (uVar17 = setup_traffic_protection(tls,0,"s hs traffic",2,0), uVar17 == 0)) {
                if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) == 0) {
                  uVar17 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_001133cd:
                  if (uVar17 == 0) {
LAB_001133d5:
                    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                    uVar17 = 0x202;
                  }
                }
                else {
                  puVar15 = (uint8_t *)malloc(0x40);
                  tls->pending_handshake_secret = puVar15;
                  if (puVar15 == (uint8_t *)0x0) {
                    uVar17 = 0x201;
                  }
                  else {
                    uVar17 = derive_secret(tls->key_schedule,puVar15,"c hs traffic");
                    if (uVar17 == 0) {
                      psVar11 = tls->ctx->update_traffic_key;
                      if (psVar11 != (st_ptls_update_traffic_key_t *)0x0) {
                        uVar17 = (*psVar11->cb)(psVar11,tls,1,2,tls->pending_handshake_secret);
                        goto LAB_001133cd;
                      }
                      goto LAB_001133d5;
                    }
                  }
                }
              }
            }
          }
          else {
            uVar17 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
            if (uVar17 == 0) {
              ppVar7 = (tls->field_20).client.key_share_ctx;
              if (ppVar7 != (ptls_key_exchange_context_t *)0x0) {
                pppVar1 = &(tls->field_20).client.key_share_ctx;
                (*ppVar7->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
                *pppVar1 = (ptls_key_exchange_context_t *)0x0;
              }
              if (((tls->field_20).server.pending_traffic_secret[0x28] & 2) != 0) {
                if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
                  __ptr = (tls->traffic_protection).enc.aead;
                  if (__ptr == (st_ptls_aead_context_t *)0x0) {
                    __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                                  ,0x892,
                                  "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                 );
                  }
                  (*__ptr->dispose_crypto)(__ptr);
                  (*ptls_clear_memory)(__ptr->static_iv,__ptr->algo->iv_size);
                  free(__ptr);
                  (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                }
                puVar21 = (tls->field_20).server.pending_traffic_secret + 0x28;
                *puVar21 = *puVar21 & 0xfd;
              }
              if (auStack_50._0_2_ == 0xffff) {
                if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
              }
              else {
                pppVar18 = tls->ctx->key_exchanges;
                ppVar8 = *pppVar18;
                if (ppVar8 == (ptls_key_exchange_algorithm_t *)0x0) {
                  return 0x2f;
                }
                uVar5 = ppVar8->id;
                while (uVar5 != auStack_50._0_2_) {
                  pppVar18 = pppVar18 + 1;
                  ppVar8 = *pppVar18;
                  if (ppVar8 == (ptls_key_exchange_algorithm_t *)0x0) {
                    return 0x2f;
                  }
                  uVar5 = ppVar8->id;
                }
                tls->key_share = ppVar8;
              }
              key_schedule_transform_post_ch1hash(tls->key_schedule);
              local_d8 = tls->key_schedule;
              if (local_d8->num_hashes != 0) {
                pppVar19 = &local_d8->hashes[0].ctx;
                sVar23 = 0;
                do {
                  local_b0 = pppVar19;
                  (*(*pppVar19)->update)(*pppVar19,emitter_00,(size_t)puVar15);
                  sVar23 = sVar23 + 1;
                  pppVar19 = local_b0 + 2;
                } while (sVar23 != local_d8->num_hashes);
              }
              iVar14 = send_client_hello(tls,emitter,properties,&local_48);
              return iVar14;
            }
          }
        }
      }
    }
LAB_001132d1:
    if (local_a8.base != (uint8_t *)0x0) {
      (*ptls_clear_memory)(local_a8.base,local_a8.len);
      free(local_a8.base);
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    uVar17 = 10;
    if (cVar3 == '\b') {
      iVar14 = client_handle_encrypted_extensions(tls,message,properties);
      return iVar14;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar3 == '\v') {
LAB_0011303a:
      iVar14 = client_handle_certificate(tls,message);
      return iVar14;
    }
    if (cVar3 == '\x19') goto LAB_001130d8;
    uVar17 = 10;
    if (cVar3 == '\r') {
      iVar14 = client_handle_certificate_request(tls,message,message_00.len);
      return iVar14;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar3 == '\x19') {
LAB_001130d8:
      iVar14 = client_handle_compressed_certificate(tls,message);
      return iVar14;
    }
    uVar17 = 10;
    if (cVar3 == '\v') goto LAB_0011303a;
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar3 != '\x0f') {
      return 10;
    }
    iVar14 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar14 != 0) {
      return iVar14;
    }
    tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
    goto LAB_001130fe;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    uVar17 = 10;
    if (is_end_of_record != 0 && cVar3 == '\x14') {
      iVar14 = client_handle_finished(tls,emitter,message);
      return iVar14;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
  case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
    uVar17 = 0x28;
    if (is_end_of_record != 0 && cVar3 == '\x01') goto LAB_00112e6b;
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
    uVar17 = 10;
    if (cVar3 == '\v') {
      iVar14 = server_handle_certificate(tls,message);
      return iVar14;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
    if (cVar3 != '\x0f') {
      return 10;
    }
    iVar14 = handle_certificate_verify(tls,message,"TLS 1.3, client CertificateVerify");
    if (iVar14 != 0) {
      return iVar14;
    }
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
LAB_001130fe:
    uVar17 = 0x202;
    break;
  case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
    if ((tls->ctx->field_0x68 & 0x10) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0x1117,
                    "int handle_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    uVar17 = 10;
    if (cVar3 == '\x05') {
      iVar14 = server_handle_end_of_early_data(tls,message);
      return iVar14;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    uVar17 = 0x28;
    if (is_end_of_record != 0 && cVar3 == '\x14') {
      iVar14 = server_handle_finished(tls,message);
      return iVar14;
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar3 == '\x18') {
LAB_001130b9:
      message_00.base = puVar15;
      iVar14 = handle_key_update(tls,emitter_00,message_00);
      return iVar14;
    }
    uVar17 = 10;
    if (cVar3 == '\x04') {
      iVar14 = client_handle_new_session_ticket(tls,message);
      return iVar14;
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    uVar17 = 10;
    if (cVar3 == '\x18') goto LAB_001130b9;
  }
  return uVar17;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                    ptls_handshake_properties_t *properties)
{
    int ret;
    if (tls->in_handshake)
        return(server_handle_hello(tls, emitter, message, properties));
    uint8_t type = message.base[0];

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}